

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<char>::PropertyT(PropertyT<char> *this,PropertyT<char> *_rhs)

{
  PropertyT<char> *_rhs_local;
  PropertyT<char> *this_local;
  
  BaseProperty::BaseProperty(&this->super_BaseProperty,&_rhs->super_BaseProperty);
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_003de240;
  std::vector<char,_std::allocator<char>_>::vector(&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}